

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DecorationManager::AddDecoration(DecorationManager *this,Instruction *inst)

{
  uint uVar1;
  Op OVar2;
  uint32_t uVar3;
  mapped_type *pmVar4;
  uint32_t local_3c;
  mapped_type *pmStack_38;
  uint32_t target_id_1;
  TargetData *target_data;
  uint local_28;
  uint32_t target_id_2;
  uint32_t i;
  uint32_t stride;
  uint32_t start;
  uint32_t target_id;
  Instruction *inst_local;
  DecorationManager *this_local;
  
  _start = inst;
  inst_local = (Instruction *)this;
  OVar2 = opt::Instruction::opcode(inst);
  if (1 < OVar2 - OpDecorate) {
    if (OVar2 - OpGroupDecorate < 2) {
      OVar2 = opt::Instruction::opcode(_start);
      local_28 = 2;
      target_id_2 = local_28;
      i = local_28;
      if (OVar2 == OpGroupDecorate) {
        local_28 = 1;
        target_id_2 = local_28;
        i = local_28;
      }
      for (; uVar1 = local_28, uVar3 = opt::Instruction::NumInOperands(_start), uVar1 < uVar3;
          local_28 = target_id_2 + local_28) {
        target_data._4_4_ = opt::Instruction::GetSingleWordInOperand(_start,local_28);
        pmStack_38 = std::
                     unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
                     ::operator[](&this->id_to_decoration_insts_,
                                  (key_type *)((long)&target_data + 4));
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back(&pmStack_38->indirect_decorations,(value_type *)&start);
      }
      local_3c = opt::Instruction::GetSingleWordInOperand(_start,0);
      pmVar4 = std::
               unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
               ::operator[](&this->id_to_decoration_insts_,&local_3c);
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(&pmVar4->decorate_insts,(value_type *)&start);
      return;
    }
    if ((OVar2 != OpDecorateId) && (OVar2 != OpDecorateString)) {
      return;
    }
  }
  stride = opt::Instruction::GetSingleWordInOperand(_start,0);
  pmVar4 = std::
           unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
           ::operator[](&this->id_to_decoration_insts_,&stride);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  push_back(&pmVar4->direct_decorations,(value_type *)&start);
  return;
}

Assistant:

void DecorationManager::AddDecoration(Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorate: {
      const auto target_id = inst->GetSingleWordInOperand(0u);
      id_to_decoration_insts_[target_id].direct_decorations.push_back(inst);
      break;
    }
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate: {
      const uint32_t start =
          inst->opcode() == spv::Op::OpGroupDecorate ? 1u : 2u;
      const uint32_t stride = start;
      for (uint32_t i = start; i < inst->NumInOperands(); i += stride) {
        const auto target_id = inst->GetSingleWordInOperand(i);
        TargetData& target_data = id_to_decoration_insts_[target_id];
        target_data.indirect_decorations.push_back(inst);
      }
      const auto target_id = inst->GetSingleWordInOperand(0u);
      id_to_decoration_insts_[target_id].decorate_insts.push_back(inst);
      break;
    }
    default:
      break;
  }
}